

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cc
# Opt level: O1

int EditDistance(StringPiece *s1,StringPiece *s2,bool allow_replacements,int max_edit_distance)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  undefined4 in_register_0000000c;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  uint uVar10;
  uint *puVar11;
  int iVar12;
  int unaff_R12D;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  vector<int,_std::allocator<int>_> row;
  allocator_type local_99;
  size_t local_98;
  int local_8c;
  undefined8 local_88;
  long local_80;
  uint *local_78;
  StringPiece *local_70;
  StringPiece *local_68;
  ulong local_60;
  ulong local_58;
  int *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_88 = CONCAT44(in_register_0000000c,max_edit_distance);
  sVar2 = s1->len_;
  sVar3 = s2->len_;
  local_80 = sVar3 << 0x20;
  local_70 = s1;
  local_68 = s2;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,local_80 + 0x100000000 >> 0x20,&local_99)
  ;
  iVar15 = (int)sVar3;
  if (0 < iVar15) {
    uVar8 = 1;
    do {
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8] = (int)uVar8;
      uVar8 = uVar8 + 1;
    } while (iVar15 + 1 != uVar8);
  }
  uVar10 = (uint)sVar2;
  bVar18 = (int)uVar10 < 1;
  iVar13 = unaff_R12D;
  if (0 < (int)uVar10) {
    iVar6 = (int)local_88;
    local_8c = iVar6 + 1;
    local_60 = (ulong)(uVar10 & 0x7fffffff);
    local_58 = (ulong)(uVar10 + 1);
    local_50 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_78 = (uint *)(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 1);
    uVar8 = 1;
    do {
      iVar12 = (int)uVar8;
      *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = iVar12;
      if (0 < iVar15) {
        uVar1 = uVar8 - 1;
        pcVar4 = local_70->str_;
        pcVar5 = local_68->str_;
        lVar14 = 0;
        uVar7 = uVar1 & 0xffffffff;
        uVar17 = uVar8 & 0xffffffff;
        puVar9 = local_78;
        do {
          uVar16 = (uint)uVar7;
          uVar10 = *puVar9;
          uVar7 = (ulong)uVar10;
          if (allow_replacements) {
            uVar16 = uVar16 + (pcVar4[uVar1] != pcVar5[lVar14]);
            puVar11 = puVar9 + -1;
            if ((int)uVar10 < (int)puVar9[-1]) {
              puVar11 = puVar9;
            }
            if ((int)(*puVar11 + 1) < (int)uVar16) {
              uVar16 = *puVar11 + 1;
            }
          }
          else if (pcVar4[uVar1] != pcVar5[lVar14]) {
            puVar11 = puVar9 + -1;
            if ((int)uVar10 < (int)puVar9[-1]) {
              puVar11 = puVar9;
            }
            uVar16 = *puVar11 + 1;
          }
          if ((int)uVar16 < (int)uVar17) {
            uVar17 = (ulong)uVar16;
          }
          iVar12 = (int)uVar17;
          *puVar9 = uVar16;
          puVar9 = puVar9 + 1;
          lVar14 = lVar14 + 1;
        } while ((ulong)(iVar15 + 1) - 1 != lVar14);
      }
      iVar13 = local_8c;
      if (iVar6 < iVar12 && iVar6 != 0) break;
      bVar18 = local_60 <= uVar8;
      uVar8 = uVar8 + 1;
      iVar13 = unaff_R12D;
    } while (uVar8 != local_58);
  }
  if (bVar18) {
    iVar13 = *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + (local_80 >> 0x1e));
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    local_98 = sVar3;
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar13;
}

Assistant:

int EditDistance(const StringPiece& s1,
                 const StringPiece& s2,
                 bool allow_replacements,
                 int max_edit_distance) {
  // The algorithm implemented below is the "classic"
  // dynamic-programming algorithm for computing the Levenshtein
  // distance, which is described here:
  //
  //   http://en.wikipedia.org/wiki/Levenshtein_distance
  //
  // Although the algorithm is typically described using an m x n
  // array, only one row plus one element are used at a time, so this
  // implementation just keeps one vector for the row.  To update one entry,
  // only the entries to the left, top, and top-left are needed.  The left
  // entry is in row[x-1], the top entry is what's in row[x] from the last
  // iteration, and the top-left entry is stored in previous.
  int m = s1.len_;
  int n = s2.len_;

  vector<int> row(n + 1);
  for (int i = 1; i <= n; ++i)
    row[i] = i;

  for (int y = 1; y <= m; ++y) {
    row[0] = y;
    int best_this_row = row[0];

    int previous = y - 1;
    for (int x = 1; x <= n; ++x) {
      int old_row = row[x];
      if (allow_replacements) {
        row[x] = min(previous + (s1.str_[y - 1] == s2.str_[x - 1] ? 0 : 1),
                     min(row[x - 1], row[x]) + 1);
      }
      else {
        if (s1.str_[y - 1] == s2.str_[x - 1])
          row[x] = previous;
        else
          row[x] = min(row[x - 1], row[x]) + 1;
      }
      previous = old_row;
      best_this_row = min(best_this_row, row[x]);
    }

    if (max_edit_distance && best_this_row > max_edit_distance)
      return max_edit_distance + 1;
  }

  return row[n];
}